

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

bool __thiscall QAbstractScrollArea::event(QAbstractScrollArea *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  Reason RVar3;
  int iVar4;
  int iVar5;
  QAbstractScrollAreaPrivate *pQVar6;
  QStyle *pQVar7;
  QGesture *pQVar8;
  qreal *pqVar9;
  ulong uVar10;
  QPointF *this_00;
  QScrollBar *this_01;
  QPoint QVar11;
  uint *__addr_len;
  sockaddr *__addr;
  QSizeF *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double awidth;
  QScrollBar *vBar_2;
  QScrollBar *hBar_2;
  QScrollEvent *se_1;
  QScrollBar *vBar_1;
  QScrollBar *hBar_1;
  QScrollPrepareEvent *se;
  int newY;
  int newX;
  QScrollBar *vBar;
  QScrollBar *hBar;
  QPanGesture *g;
  QGestureEvent *ge;
  QAbstractScrollAreaPrivate *d;
  QPoint delta_1;
  QPointF delta;
  QPainter p;
  QStyleOption option;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  undefined4 in_stack_fffffffffffffdd0;
  GestureType in_stack_fffffffffffffdd4;
  QGestureEvent *in_stack_fffffffffffffdd8;
  QWidget *in_stack_fffffffffffffde0;
  QStyleOption *in_stack_fffffffffffffde8;
  QPoint *in_stack_fffffffffffffdf8;
  QSizeF *pQVar12;
  QWidget *in_stack_fffffffffffffe00;
  bool local_131;
  QPointF local_e8;
  QPointF local_d8;
  QPointF local_c8;
  QRectF local_b8;
  QSize local_98;
  QPointF local_80;
  QPoint local_70;
  QPointF local_68;
  undefined1 *local_58;
  QSize local_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QAbstractScrollArea *)0x4984f1);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  __addr_len = &switchD_00498534::switchdataD_00ab1fa8;
  switch(TVar2) {
  case MouseButtonPress:
  case MouseButtonRelease:
  case MouseButtonDblClick:
  case MouseMove:
  case Wheel:
  case DragEnter:
  case DragMove:
  case DragLeave:
  case Drop:
  case TouchBegin:
  case TouchUpdate:
  case TouchEnd:
    local_131 = false;
    break;
  case Paint:
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              (in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
               (int)in_stack_fffffffffffffde0);
    QStyleOption::initFrom(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    if (bVar1) {
      local_38._0_4_ = (pQVar6->cornerPaintingRect).x1;
      local_38._4_4_ = (pQVar6->cornerPaintingRect).y1;
      local_30._0_4_ = (pQVar6->cornerPaintingRect).x2;
      local_30._4_4_ = (pQVar6->cornerPaintingRect).y2;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_58,(QPaintDevice *)(in_RDI + 0x10));
      pQVar7 = QWidget::style((QWidget *)
                              CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      (**(code **)(*(long *)pQVar7 + 0xb0))(pQVar7,0x28,local_48,&local_58,in_RDI);
      QPainter::~QPainter((QPainter *)&local_58);
    }
    QStyleOption::~QStyleOption
              ((QStyleOption *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    QFrame::paintEvent((QFrame *)in_stack_fffffffffffffdd8,
                       (QPaintEvent *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
    ;
    goto LAB_00498d70;
  case Resize:
    if ((pQVar6->inResize & 1U) == 0) {
      pQVar6->inResize = true;
      QAbstractScrollAreaPrivate::layoutChildren
                ((QAbstractScrollAreaPrivate *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      pQVar6->inResize = false;
    }
    goto LAB_00498d70;
  case Show:
    if (((pQVar6->shownOnce & 1U) == 0) && (pQVar6->sizeAdjustPolicy == AdjustToContentsOnFirstShow)
       ) {
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      pQVar6->sizeHint = local_50;
      QWidget::updateGeometry
                ((QWidget *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    }
    pQVar6->shownOnce = true;
    local_131 = QFrame::event((QFrame *)in_stack_fffffffffffffde0,
                              &in_stack_fffffffffffffdd8->super_QEvent);
    break;
  case ApplicationLayoutDirectionChange:
  case LayoutRequest:
  case LayoutDirectionChange:
  case StyleChange:
    QAbstractScrollAreaPrivate::layoutChildren
              ((QAbstractScrollAreaPrivate *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  default:
    local_131 = QFrame::event((QFrame *)in_stack_fffffffffffffde0,
                              &in_stack_fffffffffffffdd8->super_QEvent);
    break;
  case ContextMenu:
    RVar3 = QContextMenuEvent::reason((QContextMenuEvent *)in_RSI);
    if (RVar3 == Keyboard) {
      local_131 = QFrame::event((QFrame *)in_stack_fffffffffffffde0,
                                &in_stack_fffffffffffffdd8->super_QEvent);
      break;
    }
    QEvent::ignore((QEvent *)in_RSI);
    goto LAB_00498d70;
  case MouseTrackingChange:
    QWidget::hasMouseTracking((QWidget *)0x4985a0);
    QWidget::setMouseTracking
              ((QWidget *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (bool)in_stack_fffffffffffffdcf);
    goto LAB_00498d70;
  case AcceptDropsChange:
    if (pQVar6->viewport != (QWidget *)0x0) {
      QWidget::acceptDrops((QWidget *)0x49856a);
      QWidget::setAcceptDrops
                ((QWidget *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (bool)in_stack_fffffffffffffdcf);
    }
LAB_00498d70:
    local_131 = true;
    break;
  case Gesture:
    pQVar8 = QGestureEvent::gesture(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
    iVar4 = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    if (pQVar8 == (QGesture *)0x0) {
      local_131 = false;
    }
    else {
      horizontalScrollBar((QAbstractScrollArea *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      verticalScrollBar((QAbstractScrollArea *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      local_68.yp = -NAN;
      local_68.xp = -NAN;
      local_68 = QPanGesture::delta((QPanGesture *)
                                    CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      bVar1 = QPointF::isNull((QPointF *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      if (!bVar1) {
        bVar1 = QGuiApplication::isRightToLeft();
        if (bVar1) {
          pqVar9 = QPointF::rx(&local_68);
          *pqVar9 = *pqVar9 * -1.0;
        }
        QAbstractSlider::value
                  ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
        ;
        QPointF::x(&local_68);
        QAbstractSlider::value
                  ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
        ;
        QPointF::y(&local_68);
        QAbstractSlider::setValue((QAbstractSlider *)in_stack_fffffffffffffde8,iVar4);
        QAbstractSlider::setValue((QAbstractSlider *)in_stack_fffffffffffffde8,iVar4);
      }
      local_131 = true;
    }
    break;
  case ScrollPrepare:
    local_80 = QScrollPrepareEvent::startPos((QScrollPrepareEvent *)in_stack_fffffffffffffdd8);
    local_70 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffde0);
    uVar10 = (**(code **)(*(long *)&(pQVar6->super_QFramePrivate).super_QWidgetPrivate + 0xb0))
                       (pQVar6,&local_70);
    if ((uVar10 & 1) == 0) {
      local_131 = false;
    }
    else {
      horizontalScrollBar((QAbstractScrollArea *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      verticalScrollBar((QAbstractScrollArea *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      pQVar12 = in_RSI;
      viewport((QAbstractScrollArea *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
      ;
      local_98 = QWidget::size((QWidget *)
                               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      QSizeF::QSizeF((QSizeF *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (QSize *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      QScrollPrepareEvent::setViewportSize(pQVar12);
      iVar4 = QAbstractSlider::maximum
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      awidth = (double)iVar4;
      iVar4 = QAbstractSlider::maximum
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      QRectF::QRectF(&local_b8,0.0,0.0,awidth,(double)iVar4);
      QScrollPrepareEvent::setContentPosRange((QRectF *)in_RSI);
      iVar4 = QAbstractSlider::value
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      iVar5 = QAbstractSlider::value
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      QPointF::QPointF(&local_c8,(double)iVar4,(double)iVar5);
      iVar4 = (int)&local_c8;
      QScrollPrepareEvent::setContentPos((QPointF *)in_RSI);
      QEvent::accept((QEvent *)in_RSI,iVar4,__addr,__addr_len);
      local_131 = true;
    }
    break;
  case Scroll:
    this_00 = (QPointF *)
              horizontalScrollBar((QAbstractScrollArea *)
                                  CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    this_01 = verticalScrollBar((QAbstractScrollArea *)
                                CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    local_d8 = QScrollEvent::contentPos((QScrollEvent *)in_stack_fffffffffffffdd8);
    QPointF::x(&local_d8);
    QAbstractSlider::setValue
              ((QAbstractSlider *)in_stack_fffffffffffffde8,(int)((ulong)this_00 >> 0x20));
    local_e8 = QScrollEvent::contentPos((QScrollEvent *)in_stack_fffffffffffffdd8);
    QPointF::y(&local_e8);
    QAbstractSlider::setValue(&this_01->super_QAbstractSlider,(int)((ulong)this_00 >> 0x20));
    QScrollEvent::overshootDistance((QScrollEvent *)in_stack_fffffffffffffdd8);
    QPointF::toPoint(this_00);
    ::operator-((QPoint *)this_00,(QPoint *)in_stack_fffffffffffffdd8);
    bVar1 = QPoint::isNull((QPoint *)this_00);
    if (!bVar1) {
      in_stack_fffffffffffffdd8 =
           (QGestureEvent *)
           viewport((QAbstractScrollArea *)
                    CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      viewport((QAbstractScrollArea *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
      ;
      QWidget::pos((QWidget *)in_stack_fffffffffffffdd8);
      ::operator+((QPoint *)this_00,(QPoint *)in_stack_fffffffffffffdd8);
      QWidget::move(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    QScrollEvent::overshootDistance((QScrollEvent *)in_stack_fffffffffffffdd8);
    QVar11 = QPointF::toPoint(this_00);
    pQVar6->overshoot = QVar11;
    local_131 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_131;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractScrollArea::event(QEvent *e)
{
    Q_D(QAbstractScrollArea);
    switch (e->type()) {
    case QEvent::AcceptDropsChange:
        // There was a chance that with accessibility client we get an
        // event before the viewport was created.
        // Also, in some cases we might get here from QWidget::event() virtual function which is (indirectly) called
        // from the viewport constructor at the time when the d->viewport is not yet initialized even without any
        // accessibility client. See qabstractscrollarea autotest for a test case.
        if (d->viewport)
            d->viewport->setAcceptDrops(acceptDrops());
        break;
    case QEvent::MouseTrackingChange:
        d->viewport->setMouseTracking(hasMouseTracking());
        break;
    case QEvent::Resize:
        if (!d->inResize) {
            d->inResize = true;
            d->layoutChildren();
            d->inResize = false;
        }
        break;
    case QEvent::Show:
        if (!d->shownOnce && d->sizeAdjustPolicy == QAbstractScrollArea::AdjustToContentsOnFirstShow) {
            d->sizeHint = QSize();
            updateGeometry();
        }
        d->shownOnce = true;
        return QFrame::event(e);
    case QEvent::Paint: {
        QStyleOption option;
        option.initFrom(this);
        if (d->cornerPaintingRect.isValid()) {
            option.rect = d->cornerPaintingRect;
            QPainter p(this);
            style()->drawPrimitive(QStyle::PE_PanelScrollAreaCorner, &option, &p, this);
        }
        }
        QFrame::paintEvent((QPaintEvent*)e);
        break;
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard)
           return QFrame::event(e);
        e->ignore();
        break;
#endif // QT_NO_CONTEXTMENU
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::Wheel:
#if QT_CONFIG(draganddrop)
    case QEvent::Drop:
    case QEvent::DragEnter:
    case QEvent::DragMove:
    case QEvent::DragLeave:
#endif
        // ignore touch events in case they have been propagated from the viewport
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        return false;
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    {
        QGestureEvent *ge = static_cast<QGestureEvent *>(e);
        QPanGesture *g = static_cast<QPanGesture *>(ge->gesture(Qt::PanGesture));
        if (g) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPointF delta = g->delta();
            if (!delta.isNull()) {
                if (QGuiApplication::isRightToLeft())
                    delta.rx() *= -1;
                int newX = hBar->value() - delta.x();
                int newY = vBar->value() - delta.y();
                hBar->setValue(newX);
                vBar->setValue(newY);
            }
            return true;
        }
        return false;
    }
#endif // QT_NO_GESTURES
    case QEvent::ScrollPrepare:
    {
        QScrollPrepareEvent *se = static_cast<QScrollPrepareEvent *>(e);
        if (d->canStartScrollingAt(se->startPos().toPoint())) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();

            se->setViewportSize(QSizeF(viewport()->size()));
            se->setContentPosRange(QRectF(0, 0, hBar->maximum(), vBar->maximum()));
            se->setContentPos(QPointF(hBar->value(), vBar->value()));
            se->accept();
            return true;
        }
        return false;
    }
    case QEvent::Scroll:
    {
        QScrollEvent *se = static_cast<QScrollEvent *>(e);

        QScrollBar *hBar = horizontalScrollBar();
        QScrollBar *vBar = verticalScrollBar();
        hBar->setValue(se->contentPos().x());
        vBar->setValue(se->contentPos().y());

        QPoint delta = d->overshoot - se->overshootDistance().toPoint();
        if (!delta.isNull())
            viewport()->move(viewport()->pos() + delta);

        d->overshoot = se->overshootDistance().toPoint();

        return true;
    }
    case QEvent::StyleChange:
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutRequest:
        d->layoutChildren();
        Q_FALLTHROUGH();
    default:
        return QFrame::event(e);
    }
    return true;
}